

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapcache.cpp
# Opt level: O1

int qt_qpixmapcache_qpixmapcache_total_used(void)

{
  ulong uVar1;
  long lVar2;
  char cVar3;
  Type *pTVar4;
  int iVar5;
  ulong uVar6;
  
  iVar5 = 0;
  cVar3 = QThread::isMainThread();
  if (cVar3 != '\0') {
    pTVar4 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_pm_cache>_>::instance
                       ();
    lVar2 = (pTVar4->super_QCache<QPixmapCache::Key,_QPixmapCacheEntry>).total;
    uVar1 = lVar2 + 0x3ff;
    uVar6 = lVar2 + 0x7fe;
    if (-1 < (long)uVar1) {
      uVar6 = uVar1;
    }
    iVar5 = (int)(uVar6 >> 10);
  }
  return iVar5;
}

Assistant:

Q_AUTOTEST_EXPORT int qt_qpixmapcache_qpixmapcache_total_used() // for tst_qpixmapcache
{
    if (!qt_pixmapcache_thread_test())
        return 0;
    return (pm_cache()->totalCost()+1023) / 1024;
}